

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raspicam_still_test.cpp
# Opt level: O2

float getParamVal(string *id,int argc,char **argv,float defvalue)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0;
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar2;
  }
  do {
    if (uVar3 == uVar2) {
      return defvalue;
    }
    bVar1 = std::operator==(id,argv[uVar2]);
    uVar2 = uVar2 + 1;
  } while (!bVar1);
  dVar4 = atof(argv[uVar2]);
  return (float)dVar4;
}

Assistant:

float getParamVal ( string id,int argc,char **argv,float defvalue ) {
    for ( int i=0; i<argc; i++ )
        if ( id== argv[i] )
            return atof ( argv[i+1] );
    return defvalue;
}